

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ToolBarLayout::setRightArrow(ToolBarLayout *this,NavigationArrow *a)

{
  QWidgetItem *this_00;
  NavigationArrow *a_local;
  ToolBarLayout *this_local;
  
  if ((this->right != (QWidgetItem *)0x0) && (this->right != (QWidgetItem *)0x0)) {
    (**(code **)(*(long *)this->right + 8))();
  }
  this_00 = (QWidgetItem *)operator_new(0x18);
  QWidgetItem::QWidgetItem(this_00,&a->super_QWidget);
  this->right = this_00;
  return;
}

Assistant:

void
ToolBarLayout::setRightArrow( NavigationArrow * a )
{
	if( right )
		delete right;

	right = new QWidgetItem( a );
}